

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  LodePNGColorType colortype;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  uchar *out_00;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  size_t sVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  size_t __size;
  ulong uVar16;
  uint uVar17;
  size_t __size_00;
  size_t bytewidth;
  ulong uVar18;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  ulong local_290;
  ulong local_248;
  uint local_238 [8];
  uint local_218 [8];
  uint local_1f8 [8];
  uint local_1d8 [8];
  size_t local_1b8 [8];
  size_t local_178 [7];
  size_t local_140;
  size_t local_138 [8];
  size_t local_f8 [7];
  size_t local_c0;
  size_t local_b8 [8];
  size_t local_78 [9];
  
  colortype = (info_png->color).colortype;
  uVar7 = (info_png->color).bitdepth;
  uVar6 = getNumColorChannels(colortype);
  uVar6 = uVar6 * uVar7;
  uVar11 = (ulong)uVar6;
  if (info_png->interlace_method == 0) {
    sVar12 = w * uVar11;
    __size_00 = (sVar12 + 7 >> 3) * (ulong)h;
    __size = h + __size_00;
    *outsize = __size;
    puVar8 = (uchar *)malloc(__size);
    *out = puVar8;
    if (__size != 0 && puVar8 == (uchar *)0x0) {
      return 0x53;
    }
    if ((7 < uVar6) || (uVar11 = sVar12 + 7 & 0xffffffff8, sVar12 - uVar11 == 0)) {
      uVar7 = filter(puVar8,in,w,h,(LodePNGColorMode *)(ulong)colortype,
                     (LodePNGEncoderSettings *)(ulong)uVar7);
      return uVar7;
    }
    out_00 = (uchar *)malloc(__size_00);
    if (out_00 == (uchar *)0x0) {
      uVar7 = 0x53;
    }
    else {
      addPaddingBits(out_00,in,uVar11,sVar12,h);
      uVar7 = filter(puVar8,out_00,w,h,(LodePNGColorMode *)(ulong)colortype,
                     (LodePNGEncoderSettings *)(ulong)uVar7);
    }
  }
  else {
    Adam7_getpassvalues(local_218,local_238,local_178,local_1b8,local_f8,w,h,uVar6);
    *outsize = local_140;
    puVar8 = (uchar *)malloc(local_140);
    *out = puVar8;
    out_00 = (uchar *)malloc(local_c0);
    if ((puVar8 == (uchar *)0x0) || (local_c0 != 0 && out_00 == (uchar *)0x0)) {
LAB_001e6264:
      uVar7 = 0x53;
    }
    else {
      Adam7_getpassvalues(local_1d8,local_1f8,local_78,local_b8,local_138,w,h,uVar6);
      if (uVar6 < 8) {
        lVar10 = 0;
        do {
          uVar7 = local_1f8[lVar10];
          if (uVar7 != 0) {
            uVar1 = local_1d8[lVar10];
            uVar14 = 0;
            do {
              if ((ulong)uVar1 != 0) {
                uVar2 = ADAM7_DY[lVar10];
                uVar3 = ADAM7_IY[lVar10];
                uVar4 = ADAM7_DX[lVar10];
                sVar12 = local_138[lVar10];
                uVar5 = ADAM7_IX[lVar10];
                uVar16 = 0;
                do {
                  if (uVar6 != 0) {
                    uVar18 = (ulong)((uVar1 * uVar14 + (int)uVar16) * uVar6) + sVar12 * 8;
                    uVar15 = (ulong)((uVar4 * (int)uVar16 + (uVar2 * uVar14 + uVar3) * w + uVar5) *
                                    uVar6);
                    uVar9 = uVar11;
                    do {
                      bVar13 = '\x01' << (~(byte)uVar18 & 7);
                      if ((in[uVar15 >> 3] >> (~(byte)uVar15 & 7) & 1) == 0) {
                        out_00[uVar18 >> 3] = out_00[uVar18 >> 3] & ~bVar13;
                      }
                      else {
                        out_00[uVar18 >> 3] = out_00[uVar18 >> 3] | bVar13;
                      }
                      uVar18 = uVar18 + 1;
                      uVar15 = uVar15 + 1;
                      uVar17 = (int)uVar9 - 1;
                      uVar9 = (ulong)uVar17;
                    } while (uVar17 != 0);
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar16 != uVar1);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar7);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 7);
      }
      else {
        uVar16 = (ulong)(uVar6 >> 3);
        lVar10 = 0;
        do {
          uVar7 = local_1f8[lVar10];
          if ((ulong)uVar7 != 0) {
            uVar9 = (ulong)local_1d8[lVar10];
            local_248 = 0;
            local_290 = 0;
            do {
              if (uVar9 != 0) {
                uVar1 = ADAM7_DX[lVar10];
                sVar12 = local_138[lVar10];
                uVar14 = (ADAM7_DY[lVar10] * (int)local_290 + ADAM7_IY[lVar10]) * w +
                         ADAM7_IX[lVar10];
                uVar15 = uVar9;
                uVar18 = local_248;
                do {
                  memcpy(out_00 + (uVar18 & 0xffffffff) * uVar16 + sVar12,in + uVar14 * uVar16,
                         uVar16);
                  uVar14 = uVar14 + uVar1;
                  uVar18 = uVar18 + 1;
                  uVar15 = uVar15 - 1;
                } while (uVar15 != 0);
              }
              local_290 = local_290 + 1;
              local_248 = local_248 + uVar9;
            } while (local_290 != uVar7);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 7);
      }
      lVar10 = 0;
      do {
        if (uVar6 < 8) {
          puVar8 = (uchar *)malloc(*(long *)((long)local_1b8 + lVar10 * 2 + 8) -
                                   *(long *)((long)local_1b8 + lVar10 * 2));
          if (puVar8 == (uchar *)0x0) goto LAB_001e6264;
          uVar7 = *(uint *)((long)local_218 + lVar10);
          sVar12 = uVar7 * uVar11;
          uVar1 = *(uint *)((long)local_238 + lVar10);
          addPaddingBits(puVar8,out_00 + *(long *)((long)local_f8 + lVar10 * 2),
                         sVar12 + 7 & 0xffffffff8,sVar12,uVar1);
          uVar7 = filter(*out + *(long *)((long)local_178 + lVar10 * 2),puVar8,uVar7,uVar1,
                         (LodePNGColorMode *)(ulong)(info_png->color).colortype,
                         (LodePNGEncoderSettings *)(ulong)(info_png->color).bitdepth);
          free(puVar8);
        }
        else {
          uVar7 = filter(*out + *(long *)((long)local_178 + lVar10 * 2),
                         out_00 + *(long *)((long)local_1b8 + lVar10 * 2),
                         *(uint *)((long)local_218 + lVar10),*(uint *)((long)local_238 + lVar10),
                         (LodePNGColorMode *)(ulong)(info_png->color).colortype,
                         (LodePNGEncoderSettings *)(ulong)(info_png->color).bitdepth);
        }
        if (uVar7 != 0) goto LAB_001e626d;
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0x1c);
      uVar7 = 0;
    }
  }
LAB_001e626d:
  free(out_00);
  return uVar7;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
                                    unsigned w, unsigned h,
                                    const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings) {
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= possible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  size_t bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;
  if(info_png->interlace_method == 0) {
    /*image size plus an extra byte per scanline + possible padding bits*/
    *outsize = (size_t)h + ((size_t)h * (((size_t)w * bpp + 7u) / 8u));
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if(!error) {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if(bpp < 8 && (size_t)w * bpp != (((size_t)w * bpp + 7u) / 8u) * 8u) {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7u) / 8u));
        if(!padded) error = 83; /*alloc fail*/
        if(!error) {
          addPaddingBits(padded, in, (((size_t)w * bpp + 7u) / 8u) * 8u, (size_t)w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      } else {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  } else /*interlace_method is 1 (Adam7)*/ {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, (unsigned)bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if(!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if(!error) {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, (unsigned)bpp);
      for(i = 0; i != 7; ++i) {
        if(bpp < 8) {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if(!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
                         (((size_t)passw[i] * bpp + 7u) / 8u) * 8u, (size_t)passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
                         passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        } else {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
                         passw[i], passh[i], &info_png->color, settings);
        }

        if(error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}